

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3NotPureFunc(sqlite3_context *pCtx)

{
  sqlite3_context *pCtx_local;
  
  if (pCtx->pVdbe == (Vdbe *)0x0) {
    pCtx_local._4_4_ = 1;
  }
  else if (pCtx->pVdbe->aOp[pCtx->iOp].opcode == '@') {
    sqlite3_result_error
              (pCtx,"non-deterministic function in index expression or CHECK constraint",-1);
    pCtx_local._4_4_ = 0;
  }
  else {
    pCtx_local._4_4_ = 1;
  }
  return pCtx_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3NotPureFunc(sqlite3_context *pCtx){
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  if( pCtx->pVdbe==0 ) return 1;
#endif
  if( pCtx->pVdbe->aOp[pCtx->iOp].opcode==OP_PureFunc ){
    sqlite3_result_error(pCtx, 
       "non-deterministic function in index expression or CHECK constraint",
       -1);
    return 0;
  }
  return 1;
}